

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O2

void __thiscall
IO::momentsNicking(IO *this,vector<ModelInstance_*,_std::allocator<ModelInstance_*>_> *sims,
                  string *filename)

{
  pointer ppMVar1;
  ModelInstance *pMVar2;
  ostream *poVar3;
  pointer ppMVar4;
  ofstream outstream;
  
  std::ofstream::ofstream(&outstream);
  std::ofstream::open((string *)&outstream,(_Ios_Openmode)filename);
  ppMVar1 = (sims->super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppMVar4 = (sims->super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>).
                 _M_impl.super__Vector_impl_data._M_start; ppMVar4 != ppMVar1; ppMVar4 = ppMVar4 + 1
      ) {
    pMVar2 = *ppMVar4;
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&outstream,pMVar2->nick1);
    poVar3 = std::operator<<(poVar3,"\t");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,pMVar2->nick2);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&outstream);
  return;
}

Assistant:

void IO::momentsNicking(std::vector<ModelInstance*> sims, std::string filename) {
	std::ofstream outstream;
	outstream.open(filename, std::ios::app);
	for (ModelInstance* model: sims){
		outstream << model->nick1 << "\t" << model->nick2 << std::endl;
	}
	outstream.close();
}